

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O2

void Cec_ManSimSetDefaultParams(Cec_ParSim_t *p)

{
  p->nWords = 0x1f;
  p->nFrames = 100;
  p->nRounds = 0x14;
  p->nNonRefines = 3;
  p->fLatchCorr = 0;
  p->fConstCorr = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  p->TimeLimit = 0;
  p->fDualOut = 0;
  p->fCheckMiter = 0;
  p->fSeqSimulate = 0;
  return;
}

Assistant:

void Cec_ManSimSetDefaultParams( Cec_ParSim_t * p )
{
    memset( p, 0, sizeof(Cec_ParSim_t) );
    p->nWords         =      31;  // the number of simulation words
    p->nFrames        =     100;  // the number of simulation frames
    p->nRounds        =      20;  // the max number of simulation rounds
    p->nNonRefines    =       3;  // the max number of rounds without refinement
    p->TimeLimit      =       0;  // the runtime limit in seconds
    p->fCheckMiter    =       0;  // the circuit is the miter
//    p->fFirstStop     =       0;  // stop on the first sat output
    p->fDualOut       =       0;  // miter with separate outputs
    p->fConstCorr     =       0;  // consider only constants
    p->fSeqSimulate   =       0;  // performs sequential simulation
    p->fVeryVerbose   =       0;  // verbose stats
    p->fVerbose       =       0;  // verbose stats
}